

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_byteop(compiler_state_t *cstate,int op,int idx,int val)

{
  block *pbVar1;
  slist *local_38;
  slist *s;
  block *b;
  int val_local;
  int idx_local;
  int op_local;
  compiler_state_t *cstate_local;
  
  if (op == 0x26) {
    local_38 = new_stmt(cstate,0x54);
  }
  else {
    if (op == 0x3c) {
      pbVar1 = gen_cmp_lt(cstate,OR_LINKHDR,idx,0x10,val);
      return pbVar1;
    }
    if (op == 0x3d) {
      pbVar1 = gen_cmp(cstate,OR_LINKHDR,idx,0x10,val);
      return pbVar1;
    }
    if (op == 0x3e) {
      pbVar1 = gen_cmp_gt(cstate,OR_LINKHDR,idx,0x10,val);
      return pbVar1;
    }
    if (op != 0x7c) {
      abort();
    }
    local_38 = new_stmt(cstate,0x44);
  }
  (local_38->s).k = val;
  pbVar1 = new_block(cstate,0x15);
  pbVar1->stmts = local_38;
  gen_not(pbVar1);
  return pbVar1;
}

Assistant:

struct block *
gen_byteop(compiler_state_t *cstate, int op, int idx, int val)
{
	struct block *b;
	struct slist *s;

	switch (op) {
	default:
		abort();

	case '=':
		return gen_cmp(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);

	case '<':
		b = gen_cmp_lt(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);
		return b;

	case '>':
		b = gen_cmp_gt(cstate, OR_LINKHDR, (u_int)idx, BPF_B, (bpf_int32)val);
		return b;

	case '|':
		s = new_stmt(cstate, BPF_ALU|BPF_OR|BPF_K);
		break;

	case '&':
		s = new_stmt(cstate, BPF_ALU|BPF_AND|BPF_K);
		break;
	}
	s->s.k = val;
	b = new_block(cstate, JMP(BPF_JEQ));
	b->stmts = s;
	gen_not(b);

	return b;
}